

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> * __thiscall
crnlib::vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator=
          (vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> *this,
          vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> *other)

{
  uint local_34;
  vq_node *pvStack_30;
  uint i;
  vq_node *pSrc;
  vq_node *pDst;
  vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> *other_local;
  vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> *this_local;
  
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      clear(this);
      increase_capacity(this,other->m_size,false,false);
    }
    else {
      resize(this,0,false);
    }
    pvStack_30 = other->m_p;
    pSrc = this->m_p;
    for (local_34 = other->m_size; local_34 != 0; local_34 = local_34 - 1) {
      helpers::
      construct<crnlib::clusterizer<crnlib::vec<16u,float>>::vq_node,crnlib::clusterizer<crnlib::vec<16u,float>>::vq_node>
                (pSrc,pvStack_30);
      pvStack_30 = pvStack_30 + 1;
      pSrc = pSrc + 1;
    }
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

inline vector& operator=(const vector& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (m_capacity >= other.m_size)
            {
                resize(0);
            }
            else
            {
                clear();
                increase_capacity(other.m_size, false);
            }

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
            }
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint i = other.m_size; i > 0; i--)
                {
                    helpers::construct(pDst++, *pSrc++);
                }
            }

            m_size = other.m_size;

            return *this;
        }